

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.cpp
# Opt level: O2

string * __thiscall
CppGenerator::getLowerPointer
          (string *__return_storage_ptr__,CppGenerator *this,string *rel_name,size_t depth)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_98;
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (depth == 0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"0",(allocator *)&bStack_98);
  }
  else {
    std::operator+(&local_38,"lowerptr_",rel_name);
    std::operator+(&local_58,&local_38,"[");
    std::__cxx11::to_string(&local_78,depth - 1);
    std::operator+(&bStack_98,&local_58,&local_78);
    std::operator+(__return_storage_ptr__,&bStack_98,"]");
    std::__cxx11::string::~string((string *)&bStack_98);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string CppGenerator::getLowerPointer(const std::string rel_name, size_t depth)
{
    if (depth == 0)
        return "0";
    return "lowerptr_"+rel_name+"["+std::to_string(depth-1)+"]";
}